

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Action<int_(int,_int,_int,_int,_int,_int,_int)> * __thiscall
testing::internal::OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int)>::GetAction
          (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int)> *this)

{
  int iVar1;
  allocator<char> local_31;
  string local_30;
  OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int)> *local_10;
  OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int)> *this_local;
  
  iVar1 = *(int *)(this + 0xc);
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_31);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return (Action<int_(int,_int,_int,_int,_int,_int,_int)> *)(this + 0xd0);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }